

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O2

int gmatch(lua_State *L)

{
  char *pcVar1;
  char *pcVar2;
  lua_Integer pos;
  size_t sVar3;
  undefined8 *puVar4;
  ulong uVar5;
  size_t lp;
  size_t ls;
  
  pcVar1 = luaL_checklstring(L,1,&ls);
  pcVar2 = luaL_checklstring(L,2,&lp);
  pos = luaL_optinteger(L,3,1);
  sVar3 = posrelatI(pos,ls);
  lua_settop(L,2);
  puVar4 = (undefined8 *)lua_newuserdata(L,0x240);
  puVar4[6] = L;
  *(undefined4 *)(puVar4 + 7) = 200;
  puVar4[3] = pcVar1;
  uVar5 = ls + 1;
  if (sVar3 - 1 <= ls) {
    uVar5 = sVar3 - 1;
  }
  puVar4[4] = pcVar1 + ls;
  puVar4[5] = pcVar2 + lp;
  *puVar4 = pcVar1 + uVar5;
  puVar4[1] = pcVar2;
  puVar4[2] = 0;
  lua_pushcclosure(L,gmatch_aux,3);
  return 1;
}

Assistant:

static int gmatch (lua_State *L) {
  size_t ls, lp;
  const char *s = luaL_checklstring(L, 1, &ls);
  const char *p = luaL_checklstring(L, 2, &lp);
  size_t init = posrelatI(luaL_optinteger(L, 3, 1), ls) - 1;
  GMatchState *gm;
  lua_settop(L, 2);  /* keep strings on closure to avoid being collected */
  gm = (GMatchState *)lua_newuserdata(L, sizeof(GMatchState));
  if (init > ls)  /* start after string's end? */
    init = ls + 1;  /* avoid overflows in 's + init' */
  prepstate(&gm->ms, L, s, ls, p, lp);
  gm->src = s + init; gm->p = p; gm->lastmatch = NULL;
  lua_pushcclosure(L, gmatch_aux, 3);
  return 1;
}